

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFunctions.h
# Opt level: O3

int luabridge::detail::CFunc::Call<int_(*)(const_char_*)>::f(lua_State *L)

{
  int iVar1;
  _func_int_char_ptr *fnptr;
  _func_int_char_ptr *local_10;
  
  iVar1 = lua_type(L,-0xf4629);
  if (iVar1 != 2) {
    __assert_fail("lua_islightuserdata(L, lua_upvalueindex(1))",
                  "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/LuaBridge/Source/LuaBridge/detail/CFunctions.h"
                  ,0xf8,
                  "static int luabridge::detail::CFunc::Call<int (*)(const char *)>::f(lua_State *) [FnPtr = int (*)(const char *)]"
                 );
  }
  local_10 = (_func_int_char_ptr *)lua_touserdata(L,-0xf4629);
  if (local_10 != (_func_int_char_ptr *)0x0) {
    iVar1 = Invoke<int,luabridge::detail::TypeList<char_const*,void>,1>::run<int(*)(char_const*)>
                      (L,&local_10);
    return iVar1;
  }
  __assert_fail("fnptr != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/LuaBridge/Source/LuaBridge/detail/CFunctions.h"
                ,0xfa,
                "static int luabridge::detail::CFunc::Call<int (*)(const char *)>::f(lua_State *) [FnPtr = int (*)(const char *)]"
               );
}

Assistant:

static int f(lua_State* L)
        {
            assert(lua_islightuserdata(L, lua_upvalueindex(1)));
            FnPtr fnptr = reinterpret_cast<FnPtr>(lua_touserdata(L, lua_upvalueindex(1)));
            assert(fnptr != 0);
            return Invoke<ReturnType, Params, 1>::run(L, fnptr);
        }